

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_date.cpp
# Opt level: O2

bool ON_GetGregorianMonthAndDayOfMonth(uint year,uint day_of_year,uint *month,uint *date)

{
  uint *puVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  
  uVar4 = 0;
  if (0x62d < year) {
    puVar1 = YearDayCount(year);
    for (lVar3 = 1; lVar3 != 0xd; lVar3 = lVar3 + 1) {
      if (day_of_year <= puVar1[lVar3]) {
        uVar4 = day_of_year - puVar1[lVar3 + -1];
        uVar2 = (uint)lVar3;
        if (uVar4 == 0) {
          uVar2 = 0;
        }
        goto LAB_00457f78;
      }
    }
  }
  uVar2 = 0;
LAB_00457f78:
  if (month != (uint *)0x0) {
    *month = uVar2;
  }
  if (date != (uint *)0x0) {
    *date = uVar4;
  }
  return uVar4 != 0;
}

Assistant:

bool ON_GetGregorianMonthAndDayOfMonth(
  unsigned int year,
  unsigned int day_of_year,
  unsigned int* month,
  unsigned int* date
  )
{
  unsigned int mm = 0;
  unsigned int dd = 0;
  if( year >= FIRST_GREGORIAN_YEAR )
  {
    const unsigned int* year_day_count = YearDayCount(year);
    for ( mm = 1; mm <= 12; mm++ )
    {
      if ( day_of_year <= year_day_count[mm] )
      {
        dd = day_of_year - year_day_count[mm-1];
        break;
      }
    }
    if ( 0 == dd )
      mm = dd;
  }

  if ( 0 != month )
    *month = mm;

  if ( 0 != date )
    *date = dd;

  return (0 != dd);
}